

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void update_call_arg_area_offset(c2m_ctx_t c2m_ctx,type *type,int update_scope_p)

{
  check_ctx *pcVar1;
  void *pvVar2;
  node_t_conflict pnVar3;
  mir_size_t mVar4;
  ulong uVar5;
  
  pcVar1 = c2m_ctx->check_ctx;
  pnVar3 = DLIST_node_t_el(&(pcVar1->curr_func_def->u).ops,3);
  pvVar2 = pnVar3->attr;
  mVar4 = type_size(c2m_ctx,type);
  uVar5 = (mVar4 + 0xf & 0xfffffffffffffff0) + pcVar1->curr_call_arg_area_offset;
  pcVar1->curr_call_arg_area_offset = uVar5;
  if ((update_scope_p != 0) && (*(ulong *)((long)pvVar2 + 0x18) < uVar5)) {
    *(ulong *)((long)pvVar2 + 0x18) = uVar5;
  }
  return;
}

Assistant:

static void update_call_arg_area_offset (c2m_ctx_t c2m_ctx, struct type *type, int update_scope_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  node_t block = NL_EL (curr_func_def->u.ops, 3);
  struct node_scope *ns = block->attr;

  curr_call_arg_area_offset += round_size (type_size (c2m_ctx, type), MAX_ALIGNMENT);
  if (update_scope_p && ns->call_arg_area_size < curr_call_arg_area_offset)
    ns->call_arg_area_size = curr_call_arg_area_offset;
}